

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O2

_Bool Curl_uint_tbl_next(uint_tbl *tbl,uint last_key,uint *pkey,void **pentry)

{
  _Bool _Var1;
  
  if (pentry != (void **)0x0 && pkey != (uint *)0x0) {
    _Var1 = uint_tbl_next_at(tbl,last_key + 1,pkey,pentry);
    if (_Var1) {
      return true;
    }
    *pkey = 0xffffffff;
    *pentry = (void *)0x0;
  }
  return false;
}

Assistant:

bool Curl_uint_tbl_next(struct uint_tbl *tbl, unsigned int last_key,
                        unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(uint_tbl_next_at(tbl, last_key + 1, pkey, pentry))
    return TRUE;
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}